

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O2

TypeArray *
soul::AST::CommaSeparatedList::getListOfResultTypes
          (TypeArray *__return_storage_ptr__,pool_ptr<soul::AST::Expression> *expressionOrList)

{
  long lVar1;
  ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> list;
  pool_ptr<soul::AST::Expression> local_88;
  ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> local_80;
  Type local_48;
  
  __return_storage_ptr__->items = (Type *)__return_storage_ptr__->space;
  __return_storage_ptr__->numActive = 0;
  __return_storage_ptr__->numAllocated = 8;
  local_88 = (pool_ptr<soul::AST::Expression>)expressionOrList->object;
  getAsExpressionList(&local_80,&local_88);
  ArrayWithPreallocation<soul::Type,_8UL>::reserve(__return_storage_ptr__,local_80.numActive);
  for (lVar1 = 0; local_80.numActive << 3 != lVar1; lVar1 = lVar1 + 8) {
    (**(code **)(**(long **)((long)&(local_80.items)->object + lVar1) + 0x20))(&local_48);
    ArrayWithPreallocation<soul::Type,_8UL>::push_back(__return_storage_ptr__,&local_48);
    RefCountedPtr<soul::Structure>::~RefCountedPtr(&local_48.structure);
  }
  ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::clear(&local_80);
  return __return_storage_ptr__;
}

Assistant:

static TypeArray getListOfResultTypes (pool_ptr<Expression> expressionOrList)
        {
            TypeArray types;
            auto list = getAsExpressionList (expressionOrList);
            types.reserve (list.size());

            for (auto& i : list)
                types.push_back (i->getResultType());

            return types;
        }